

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O2

string * __thiscall
t_html_generator::make_file_link
          (string *__return_storage_ptr__,t_html_generator *this,string *filename)

{
  int iVar1;
  allocator local_11;
  
  iVar1 = std::__cxx11::string::compare((string *)&this->current_file_);
  if (iVar1 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_11);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_html_generator::make_file_link(std::string filename) {
  return (current_file_.compare(filename) != 0) ? filename : "";
}